

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNMachine<unsigned_char> * __thiscall
Centaurus::CompositeATN<unsigned_char>::operator[](CompositeATN<unsigned_char> *this,Identifier *id)

{
  mapped_type *pmVar1;
  Identifier *id_local;
  CompositeATN<unsigned_char> *this_local;
  
  pmVar1 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>_>
           ::at(&this->m_dict,id);
  return pmVar1;
}

Assistant:

const CATNMachine<TCHAR>& operator[](const Identifier& id) const
    {
        return m_dict.at(id);
    }